

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

shared_ptr<chrono::ChLinkMotorRotationSpeed> __thiscall
chrono::turtlebot::AddMotor
          (turtlebot *this,shared_ptr<chrono::ChBody> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,shared_ptr<chrono::ChBodyAuxRef> *chassis,
          ChSystem *system,ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot,
          shared_ptr<chrono::ChFunction_Const> *speed_func)

{
  long *plVar1;
  ChLinkMotorRotationSpeed *this_00;
  ChFrame<double> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> sVar2;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_1d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  this_01 = (ChFrame<double> *)
            (**(code **)(*(long *)(chassis->
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x1f0))();
  ChFrame<double>::ChFrame(&local_b8,rel_joint_pos,rel_joint_rot);
  ChFrame<double>::operator*(&local_1c8,this_01,&local_b8);
  std::make_shared<chrono::ChLinkMotorRotationSpeed>();
  plVar1 = *(long **)this;
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_1f8,&body_1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_208,&body_2->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
            );
  ChFrame<double>::ChFrame(&local_140,&local_1c8.coord.pos,&local_1c8.coord.rot);
  (**(code **)(*plVar1 + 0x240))(plVar1,local_1f8,local_208,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkMotorRotationSpeed,void>
            (local_1d8,
             (__shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2> *)this);
  (**(code **)(*(long *)system + 0x138))(system,local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
  this_00 = *(ChLinkMotorRotationSpeed **)this;
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction_Const,void>
            (local_1e8,
             &speed_func->super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>);
  ChLinkMotorRotationSpeed::SetSpeedFunction(this_00,(shared_ptr<chrono::ChFunction> *)local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
  sVar2.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationSpeed>)
         sVar2.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationSpeed> AddMotor(std::shared_ptr<ChBody> body_1,
                                                   std::shared_ptr<ChBodyAuxRef> body_2,
                                                   std::shared_ptr<ChBodyAuxRef> chassis,
                                                   ChSystem* system,
                                                   const ChVector<>& rel_joint_pos,
                                                   const ChQuaternion<>& rel_joint_rot,
                                                   std::shared_ptr<ChFunction_Const> speed_func) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto motor_angle = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
    motor_angle->Initialize(body_1, body_2, ChFrame<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(motor_angle);
    motor_angle->SetSpeedFunction(speed_func);
    return motor_angle;
}